

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O2

void do_cmd_wiz_recall_monster(command *cmd)

{
  _Bool _Var1;
  wchar_t wVar2;
  monster_lore *lore;
  monster_race *pmVar3;
  long lVar4;
  wchar_t i;
  ulong uVar5;
  long lVar6;
  char c;
  wchar_t r_idx;
  char s [80];
  
  r_idx = (wchar_t)z_info->r_max;
  wVar2 = cmd_get_arg_number((command_conflict *)cmd,"index",&r_idx);
  if (wVar2 != L'\0') {
    s[0x40] = '\0';
    s[0x41] = '\0';
    s[0x42] = '\0';
    s[0x43] = '\0';
    s[0x44] = '\0';
    s[0x45] = '\0';
    s[0x46] = '\0';
    s[0x47] = '\0';
    s[0x48] = '\0';
    s[0x49] = '\0';
    s[0x4a] = '\0';
    s[0x4b] = '\0';
    s[0x4c] = '\0';
    s[0x4d] = '\0';
    s[0x4e] = '\0';
    s[0x4f] = '\0';
    s[0x30] = '\0';
    s[0x31] = '\0';
    s[0x32] = '\0';
    s[0x33] = '\0';
    s[0x34] = '\0';
    s[0x35] = '\0';
    s[0x36] = '\0';
    s[0x37] = '\0';
    s[0x38] = '\0';
    s[0x39] = '\0';
    s[0x3a] = '\0';
    s[0x3b] = '\0';
    s[0x3c] = '\0';
    s[0x3d] = '\0';
    s[0x3e] = '\0';
    s[0x3f] = '\0';
    s[0x20] = '\0';
    s[0x21] = '\0';
    s[0x22] = '\0';
    s[0x23] = '\0';
    s[0x24] = '\0';
    s[0x25] = '\0';
    s[0x26] = '\0';
    s[0x27] = '\0';
    s[0x28] = '\0';
    s[0x29] = '\0';
    s[0x2a] = '\0';
    s[0x2b] = '\0';
    s[0x2c] = '\0';
    s[0x2d] = '\0';
    s[0x2e] = '\0';
    s[0x2f] = '\0';
    s[0x10] = '\0';
    s[0x11] = '\0';
    s[0x12] = '\0';
    s[0x13] = '\0';
    s[0x14] = '\0';
    s[0x15] = '\0';
    s[0x16] = '\0';
    s[0x17] = '\0';
    s[0x18] = '\0';
    s[0x19] = '\0';
    s[0x1a] = '\0';
    s[0x1b] = '\0';
    s[0x1c] = '\0';
    s[0x1d] = '\0';
    s[0x1e] = '\0';
    s[0x1f] = '\0';
    s[0] = '\0';
    s[1] = '\0';
    s[2] = '\0';
    s[3] = '\0';
    s[4] = '\0';
    s[5] = '\0';
    s[6] = '\0';
    s[7] = '\0';
    s[8] = '\0';
    s[9] = '\0';
    s[10] = '\0';
    s[0xb] = '\0';
    s[0xc] = '\0';
    s[0xd] = '\0';
    s[0xe] = '\0';
    s[0xf] = '\0';
    _Var1 = get_com("Full recall for [a]ll monsters or [s]pecific monster? ",&c);
    if (!_Var1) {
      return;
    }
    if ((c & 0xdfU) == 0x53) {
      _Var1 = get_string("Which monster? ",s,0x50);
      if (!_Var1) {
        return;
      }
      _Var1 = get_int_from_string(s,&r_idx);
      if ((!_Var1) && (pmVar3 = lookup_monster(s), pmVar3 != (monster_race *)0x0)) {
        r_idx = pmVar3->ridx;
      }
    }
    else {
      if ((c & 0xdfU) != 0x41) {
        return;
      }
      r_idx = L'\xffffffff';
    }
    cmd_set_arg_number((command_conflict *)cmd,"index",r_idx);
  }
  if ((long)r_idx < 0) {
    if (r_idx == L'\xffffffff') {
      lVar4 = 0;
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < z_info->r_max; uVar5 = uVar5 + 1) {
        cheat_monster_lore((monster_race *)(r_info->flags + lVar4 + -0x5c),
                           (monster_lore *)(l_list->flags + lVar6 + -0x20));
        lVar6 = lVar6 + 0x78;
        lVar4 = lVar4 + 0xd0;
      }
      return;
    }
  }
  else if ((uint)r_idx < (uint)z_info->r_max) {
    pmVar3 = r_info + r_idx;
    lore = get_lore(pmVar3);
    cheat_monster_lore(pmVar3,lore);
    return;
  }
  msg("No monster found.");
  return;
}

Assistant:

void do_cmd_wiz_recall_monster(struct command *cmd)
{
	int r_idx = z_info->r_max;

	if (cmd_get_arg_number(cmd, "index", &r_idx) != CMD_OK) {
		char s[80] = "";
		char c;

		if (!get_com("Full recall for [a]ll monsters or [s]pecific monster? ", &c)) return;
		if (c == 'a' || c == 'A') {
			r_idx = -1;
		} else if (c == 's' || c == 'S') {
			if (!get_string("Which monster? ", s, sizeof(s)))
				return;
			if (!get_int_from_string(s, &r_idx)) {
				const struct monster_race *race =
					lookup_monster(s);

				if (race) {
					r_idx = race->ridx;
				}
			}
		} else {
			return;
		}
		cmd_set_arg_number(cmd, "index", r_idx);
	}

	if (r_idx >= 0 && r_idx < z_info->r_max) {
		const struct monster_race *race = &r_info[r_idx];

		cheat_monster_lore(race, get_lore(race));
	} else if (r_idx == -1) {
		int i;

		for (i = 0; i < z_info->r_max; i++) {
			cheat_monster_lore(&r_info[i], &l_list[i]);
		}
	} else {
		msg("No monster found.");
	}
}